

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_sha1_readable(char *display,uchar *sha)

{
  int local_78;
  int v;
  int o;
  int i;
  int acc;
  int num_bits;
  char encoding [65];
  uchar *sha_local;
  char *display_local;
  
  memcpy(&acc,"0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ%$",0x41);
  i = 0;
  o = 0;
  v = 0;
  local_78 = 0;
  do {
    if (0x19 < local_78) {
      if (i == 4) {
        display[local_78] = *(char *)((long)&acc + (long)o);
        return;
      }
      __assert_fail("num_bits == 20*8 - 26*6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x1948,"void stb_sha1_readable(char *, unsigned char *)");
    }
    if (i < 6) {
      if (v == 0x14) {
        __assert_fail("i != 20",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0x193f,"void stb_sha1_readable(char *, unsigned char *)");
      }
      o = ((uint)sha[v] << ((byte)i & 0x1f)) + o;
      i = i + 8;
      v = v + 1;
    }
    display[local_78] = *(char *)((long)&acc + (long)(int)(o & 0x3f));
    o = o >> 6;
    i = i + -6;
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

void stb_sha1_readable(char display[27], unsigned char sha[20])
{
   char encoding[65] = "0123456789abcdefghijklmnopqrstuv"
                       "wxyzABCDEFGHIJKLMNOPQRSTUVWXYZ%$";
   int num_bits = 0, acc=0;
   int i=0,o=0;
   while (o < 26) {
      int v;
      // expand the accumulator
      if (num_bits < 6) {
         assert(i != 20);
         acc += sha[i++] << num_bits;
         num_bits += 8;
      }
      v = acc & ((1 << 6) - 1);
      display[o++] = encoding[v];
      acc >>= 6;
      num_bits -= 6;
   }
   assert(num_bits == 20*8 - 26*6);
   display[o++] = encoding[acc];   
}